

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void ArrangeScriptProfiles(TArray<ProfileCollector,_ProfileCollector> *profiles)

{
  uint uVar1;
  FBehavior **ppFVar2;
  int local_3c;
  undefined1 auStack_38 [4];
  int i;
  ProfileCollector prof;
  FBehavior *module;
  uint mod_num;
  TArray<ProfileCollector,_ProfileCollector> *profiles_local;
  
  module._4_4_ = 0;
  while( true ) {
    uVar1 = TArray<FBehavior_*,_FBehavior_*>::Size(&FBehavior::StaticModules);
    if (uVar1 <= module._4_4_) break;
    ppFVar2 = TArray<FBehavior_*,_FBehavior_*>::operator[]
                        (&FBehavior::StaticModules,(ulong)module._4_4_);
    prof.ProfileData = (ACSProfileInfo *)*ppFVar2;
    prof._16_8_ = prof.ProfileData;
    for (local_3c = 0; local_3c < *(int *)(prof._16_8_ + 0x428); local_3c = local_3c + 1) {
      prof.Module._0_4_ = local_3c;
      _auStack_38 = (ACSProfileInfo *)
                    (*(long *)(prof._16_8_ + 0x420) + (long)local_3c * 0x38 + 0x20);
      TArray<ProfileCollector,_ProfileCollector>::Push(profiles,(ProfileCollector *)auStack_38);
    }
    module._4_4_ = module._4_4_ + 1;
  }
  return;
}

Assistant:

void ArrangeScriptProfiles(TArray<ProfileCollector> &profiles)
{
	for (unsigned int mod_num = 0; mod_num < FBehavior::StaticModules.Size(); ++mod_num)
	{
		FBehavior *module = FBehavior::StaticModules[mod_num];
		ProfileCollector prof;
		prof.Module = module;
		for (int i = 0; i < module->NumScripts; ++i)
		{
			prof.Index = i;
			prof.ProfileData = &module->Scripts[i].ProfileData;
			profiles.Push(prof);
		}
	}
}